

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isAlterableTable(Parse *pParse,Table *pTab)

{
  int iVar1;
  undefined8 *in_RSI;
  Parse *in_RDI;
  int local_4;
  
  iVar1 = sqlite3_strnicmp((char *)*in_RSI,"sqlite_",7);
  if ((iVar1 == 0) || ((*(uint *)(in_RSI + 6) & 0x8000) != 0)) {
LAB_00222661:
    sqlite3ErrorMsg(in_RDI,"table %s may not be altered",*in_RSI);
    local_4 = 1;
  }
  else {
    if ((*(uint *)(in_RSI + 6) & 0x1000) != 0) {
      iVar1 = sqlite3ReadOnlyShadowTables(in_RDI->db);
      if (iVar1 != 0) goto LAB_00222661;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int isAlterableTable(Parse *pParse, Table *pTab){
  if( 0==sqlite3StrNICmp(pTab->zName, "sqlite_", 7)
#ifndef SQLITE_OMIT_VIRTUALTABLE
   || (pTab->tabFlags & TF_Eponymous)!=0
   || ( (pTab->tabFlags & TF_Shadow)!=0
        && sqlite3ReadOnlyShadowTables(pParse->db)
   )
#endif
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be altered", pTab->zName);
    return 1;
  }
  return 0;
}